

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

GLuint LoadShader(GLsizei count,GLchar **shaderSource,GLint *lengths,char *shaderName,
                 GLenum shaderType)

{
  GLuint object;
  int iVar1;
  GLenum GVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined4 in_register_0000003c;
  
  GVar2 = (GLenum)shaderName;
  object = (*glad_glCreateShader)(GVar2);
  if (object == 0) {
    bov_error_log(0x20002,"shader \'%s\' creation failed",lengths);
    uVar3 = 0x9d;
  }
  else {
    (*glad_glShaderSource)
              (object,1,(GLchar **)CONCAT44(in_register_0000003c,count),(GLint *)shaderSource);
    (*glad_glCompileShader)(object);
    iVar1 = checkivError(object,0x8b81,glad_glGetShaderiv,glad_glGetShaderInfoLog);
    if (iVar1 == 0) {
      return object;
    }
    if (GVar2 == 0x8dd9) {
      pcVar4 = "geometry";
    }
    else if (GVar2 == 0x8b31) {
      pcVar4 = "vertex";
    }
    else if (GVar2 == 0x8b30) {
      pcVar4 = "fragment";
    }
    else {
      pcVar4 = "unknown-type";
    }
    bov_error_log(0x20002,"%s shader: %s compilation failed",pcVar4,lengths);
    uVar3 = 0xaf;
  }
  fprintf(_stderr,"\t(in function %s, line %d)\n","LoadShader",uVar3);
  return 0;
}

Assistant:

static GLuint LoadShader(GLsizei count,
                         const GLchar* shaderSource[],
                         const GLint* lengths,
                         const char* shaderName,
                         GLenum shaderType)
{
	GLuint shader = glCreateShader(shaderType);
	if(shader==0) {
		BOV_ERROR_LOG(BOV_SHADER_ERROR,
		              "shader '%s' creation failed",
		              shaderName);
		return 0;
	}

	glShaderSource(shader, count, shaderSource, lengths);
	glCompileShader(shader);

	if(checkivError(shader, GL_COMPILE_STATUS, glGetShaderiv,
	                glGetShaderInfoLog)){
		const char* shaderType_desc = "unknown-type";
		if(shaderType==GL_VERTEX_SHADER)
			shaderType_desc = "vertex";
		else if(shaderType==GL_FRAGMENT_SHADER)
			shaderType_desc = "fragment";
		else if(shaderType==GL_GEOMETRY_SHADER)
			shaderType_desc = "geometry";
		BOV_ERROR_LOG(BOV_SHADER_ERROR,
		              "%s shader: %s compilation failed",
		              shaderType_desc, shaderName);
		return 0;
	}

	return shader;
}